

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O2

SUNErrCode SUNLogger_Destroy(SUNLogger *logger_ptr)

{
  SUNLogger __ptr;
  SUNErrCode SVar1;
  
  if ((logger_ptr != (SUNLogger *)0x0) && (__ptr = *logger_ptr, __ptr != (SUNLogger)0x0)) {
    if (__ptr->destroy != (_func_SUNErrCode_SUNLogger_ptr *)0x0) {
      SVar1 = (*__ptr->destroy)(logger_ptr);
      return SVar1;
    }
    SUNHashMap_Destroy(&__ptr->filenames,sunCloseLogFile);
    free(__ptr);
  }
  return 0;
}

Assistant:

SUNErrCode SUNLogger_Destroy(SUNLogger* logger_ptr)
{
  int retval       = 0;
  SUNLogger logger = NULL;

  if (!logger_ptr) { return SUN_SUCCESS; }

  logger = *logger_ptr;

  if (logger && logger->destroy) { retval = logger->destroy(logger_ptr); }
  else if (logger)
  {
    /* Default implementation */

    if (sunLoggerIsOutputRank(logger, NULL))
    {
      SUNHashMap_Destroy(&logger->filenames, sunCloseLogFile);
    }

#if SUNDIALS_MPI_ENABLED
    if (logger->comm != SUN_COMM_NULL) { MPI_Comm_free(&logger->comm); }
#endif

    free(logger);
    logger = NULL;
  }

  return retval;
}